

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fPolygonOffsetTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::anon_unknown_0::ZeroSlopeTestCase::testPolygonOffset
          (ZeroSlopeTestCase *this)

{
  code *pcVar1;
  TestContext *testCtx;
  undefined *puVar2;
  bool bVar3;
  int iVar4;
  deUint32 dVar5;
  TestLog *this_00;
  MessageBuilder *pMVar6;
  RenderContext *pRVar7;
  undefined4 extraout_var;
  TestError *this_01;
  ConstPixelBufferAccess local_c58;
  ConstPixelBufferAccess local_c30;
  Vector<float,_4> local_c08;
  PixelBufferAccess local_bf8;
  MessageBuilder local_bd0;
  PixelBufferAccess local_a50;
  MessageBuilder local_a28;
  MessageBuilder local_8a8;
  MessageBuilder local_728;
  undefined4 local_5a4;
  undefined4 local_5a0;
  GLint colorLoc;
  GLint positionLoc;
  allocator<char> local_571;
  string local_570;
  ProgramSources local_550;
  undefined1 local_480 [8];
  ShaderProgram program;
  Functions *gl;
  float local_3a0;
  float local_39c;
  MessageBuilder local_398;
  ulong local_218;
  size_t ndx;
  undefined1 local_80 [8];
  Surface referenceImage;
  Surface testImage;
  TestLog *log;
  Vec4 triangle [3];
  ZeroSlopeTestCase *this_local;
  
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&log,-0.4,0.4,0.0,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(triangle[0].m_data + 2),-0.8,-0.5,0.0,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(triangle[1].m_data + 2),0.7,0.2,0.0,1.0);
  this_00 = tcu::TestContext::getLog
                      ((this->super_PolygonOffsetTestCase).super_TestCase.super_TestCase.
                       super_TestNode.m_testCtx);
  iVar4 = (this->super_PolygonOffsetTestCase).m_targetSize;
  tcu::Surface::Surface((Surface *)&referenceImage.m_pixels.m_cap,iVar4,iVar4);
  iVar4 = (this->super_PolygonOffsetTestCase).m_targetSize;
  tcu::Surface::Surface((Surface *)local_80,iVar4,iVar4);
  tcu::TestLog::operator<<
            ((MessageBuilder *)&ndx,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar6 = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)&ndx,(char (*) [33])"Setup triangle with coordinates:");
  tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&ndx);
  for (local_218 = 0; local_218 < 3; local_218 = local_218 + 1) {
    tcu::TestLog::operator<<(&local_398,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<(&local_398,(char (*) [4])"\tx=");
    local_39c = tcu::Vector<float,_4>::x((Vector<float,_4> *)(triangle[local_218 - 1].m_data + 2));
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_39c);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [4])"\ty=");
    local_3a0 = tcu::Vector<float,_4>::y((Vector<float,_4> *)(triangle[local_218 - 1].m_data + 2));
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_3a0);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [4])"\tz=");
    gl._4_4_ = tcu::Vector<float,_4>::z((Vector<float,_4> *)(triangle[local_218 - 1].m_data + 2));
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(float *)((long)&gl + 4));
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [4])"\tw=");
    gl._0_4_ = tcu::Vector<float,_4>::w((Vector<float,_4> *)(triangle[local_218 - 1].m_data + 2));
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(float *)&gl);
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_398);
  }
  pRVar7 = gles2::Context::getRenderContext
                     ((this->super_PolygonOffsetTestCase).super_TestCase.m_context);
  iVar4 = (*pRVar7->_vptr_RenderContext[3])();
  program.m_program.m_info.linkTimeUs = CONCAT44(extraout_var,iVar4);
  pRVar7 = gles2::Context::getRenderContext
                     ((this->super_PolygonOffsetTestCase).super_TestCase.m_context);
  puVar2 = Functional::(anonymous_namespace)::s_shaderSourceVertex;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_570,puVar2,&local_571);
  puVar2 = Functional::(anonymous_namespace)::s_shaderSourceFragment;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&positionLoc,puVar2,(allocator<char> *)((long)&colorLoc + 3));
  glu::makeVtxFragSources(&local_550,&local_570,(string *)&positionLoc);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_480,pRVar7,&local_550);
  glu::ProgramSources::~ProgramSources(&local_550);
  std::__cxx11::string::~string((string *)&positionLoc);
  std::allocator<char>::~allocator((allocator<char> *)((long)&colorLoc + 3));
  std::__cxx11::string::~string((string *)&local_570);
  std::allocator<char>::~allocator(&local_571);
  pcVar1 = *(code **)(program.m_program.m_info.linkTimeUs + 0x780);
  dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)local_480);
  local_5a0 = (*pcVar1)(dVar5,"a_position");
  pcVar1 = *(code **)(program.m_program.m_info.linkTimeUs + 0x780);
  dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)local_480);
  local_5a4 = (*pcVar1)(dVar5,"a_color");
  bVar3 = glu::ShaderProgram::isOk((ShaderProgram *)local_480);
  if (!bVar3) {
    glu::operator<<(this_00,(ShaderProgram *)local_480);
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_01,"Shader compile failed.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fPolygonOffsetTests.cpp"
               ,0x3ea);
    __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x1d0))(0x3f800000);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x188))(0x4100);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x1a00))
            (0,0,(this->super_PolygonOffsetTestCase).m_targetSize);
  pcVar1 = *(code **)(program.m_program.m_info.linkTimeUs + 0x1680);
  dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)local_480);
  (*pcVar1)(dVar5);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x5e0))(0xb71);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x5e0))(0x8037);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x610))(local_5a0);
  tcu::TestLog::operator<<(&local_728,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar6 = tcu::MessageBuilder::operator<<(&local_728,(char (*) [29])0x2b7f2b3);
  tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_728);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x19f0))(local_5a0,4,0x1406,0,0,&log);
  tcu::TestLog::operator<<(&local_8a8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar6 = tcu::MessageBuilder::operator<<
                     (&local_8a8,
                      (char (*) [76])
                      "Draw triangle. Color = Red.\tState: DepthFunc = ALWAYS, PolygonOffset(0, 0)."
                     );
  tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_8a8);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x4a0))(0x207);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x1028))(0);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x1858))(0x3f800000,0,local_5a4);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x538))(4,0,3);
  tcu::TestLog::operator<<(&local_a28,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar6 = tcu::MessageBuilder::operator<<
                     (&local_a28,
                      (char (*) [77])
                      "Draw triangle. Color = Black.\tState: DepthFunc = EQUAL, PolygonOffset(4, 0)."
                     );
  tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_a28);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x4a0))(0x202);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x1028))(0x40800000,0);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x1858))(0,0,0,0x3f800000,local_5a4);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x538))(4,0,3);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x518))(local_5a0);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x1680))(0);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x648))();
  pRVar7 = gles2::Context::getRenderContext
                     ((this->super_PolygonOffsetTestCase).super_TestCase.m_context);
  tcu::Surface::getAccess(&local_a50,(Surface *)&referenceImage.m_pixels.m_cap);
  glu::readPixels(pRVar7,0,0,&local_a50);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_480);
  tcu::TestLog::operator<<(&local_bd0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar6 = tcu::MessageBuilder::operator<<(&local_bd0,(char (*) [26])"Expecting black triangle.");
  tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_bd0);
  tcu::Surface::getAccess(&local_bf8,(Surface *)local_80);
  tcu::Vector<float,_4>::Vector(&local_c08,0.0,0.0,0.0,1.0);
  tcu::clear(&local_bf8,&local_c08);
  testCtx = (this->super_PolygonOffsetTestCase).super_TestCase.super_TestCase.super_TestNode.
            m_testCtx;
  pRVar7 = gles2::Context::getRenderContext
                     ((this->super_PolygonOffsetTestCase).super_TestCase.m_context);
  tcu::Surface::getAccess((PixelBufferAccess *)&local_c30,(Surface *)&referenceImage.m_pixels.m_cap)
  ;
  tcu::Surface::getAccess((PixelBufferAccess *)&local_c58,(Surface *)local_80);
  verifyImages(this_00,testCtx,pRVar7,&local_c30,&local_c58);
  tcu::Surface::~Surface((Surface *)local_80);
  tcu::Surface::~Surface((Surface *)&referenceImage.m_pixels.m_cap);
  return;
}

Assistant:

void ZeroSlopeTestCase::testPolygonOffset (void)
{
	using tcu::TestLog;

	const tcu::Vec4 triangle[] =
	{
		tcu::Vec4(-0.4f,  0.4f, 0.0f, 1.0f),
		tcu::Vec4(-0.8f, -0.5f, 0.0f, 1.0f),
		tcu::Vec4( 0.7f,  0.2f, 0.0f, 1.0f),
	};

	tcu::TestLog&		log				= m_testCtx.getLog();
	tcu::Surface		testImage		(m_targetSize, m_targetSize);
	tcu::Surface		referenceImage	(m_targetSize, m_targetSize);

	// log the triangle
	log << TestLog::Message << "Setup triangle with coordinates:" << TestLog::EndMessage;
	for (size_t ndx = 0; ndx < DE_LENGTH_OF_ARRAY(triangle); ++ndx)
		log << TestLog::Message
				<< "\tx=" << triangle[ndx].x()
				<< "\ty=" << triangle[ndx].y()
				<< "\tz=" << triangle[ndx].z()
				<< "\tw=" << triangle[ndx].w()
				<< TestLog::EndMessage;

	// render test image
	{
		const glw::Functions&		gl			= m_context.getRenderContext().getFunctions();
		const glu::ShaderProgram	program		(m_context.getRenderContext(), glu::makeVtxFragSources(s_shaderSourceVertex, s_shaderSourceFragment));
		const GLint					positionLoc = gl.getAttribLocation(program.getProgram(), "a_position");
		const GLint					colorLoc	= gl.getAttribLocation(program.getProgram(), "a_color");

		if (!program.isOk())
		{
			log << program;
			TCU_FAIL("Shader compile failed.");
		}

		gl.clearColor				(0, 0, 0, 1);
		gl.clearDepthf				(1.0f);
		gl.clear					(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
		gl.viewport					(0, 0, m_targetSize, m_targetSize);
		gl.useProgram				(program.getProgram());
		gl.enable					(GL_DEPTH_TEST);
		gl.enable					(GL_POLYGON_OFFSET_FILL);
		gl.enableVertexAttribArray	(positionLoc);

		log << TestLog::Message << "POLYGON_OFFSET_FILL enabled." << TestLog::EndMessage;

		{
			gl.vertexAttribPointer		(positionLoc, 4, GL_FLOAT, GL_FALSE, 0, triangle);

			log << TestLog::Message << "Draw triangle. Color = Red.\tState: DepthFunc = ALWAYS, PolygonOffset(0, 0)." << TestLog::EndMessage;

			gl.depthFunc				(GL_ALWAYS);
			gl.polygonOffset			(0, 0);
			gl.vertexAttrib4f			(colorLoc, 1.0f, 0.0f, 0.0f, 1.0f);
			gl.drawArrays				(GL_TRIANGLES, 0, 3);

			log << TestLog::Message << "Draw triangle. Color = Black.\tState: DepthFunc = EQUAL, PolygonOffset(4, 0)." << TestLog::EndMessage;

			gl.depthFunc				(GL_EQUAL);
			gl.polygonOffset			(4, 0);	// triangle slope == 0
			gl.vertexAttrib4f			(colorLoc, 0.0f, 0.0f, 0.0f, 1.0f);
			gl.drawArrays				(GL_TRIANGLES, 0, 3);
		}

		gl.disableVertexAttribArray	(positionLoc);
		gl.useProgram				(0);
		gl.finish					();

		glu::readPixels(m_context.getRenderContext(), 0, 0, testImage.getAccess());
	}

	// render reference image
	log << TestLog::Message << "Expecting black triangle." << TestLog::EndMessage;
	tcu::clear(referenceImage.getAccess(), tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f));

	// compare
	verifyImages(log, m_testCtx, m_context.getRenderContext(), testImage.getAccess(), referenceImage.getAccess());
}